

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall adios2::core::IO::SetParameters(IO *this,string *parameters)

{
  int iVar1;
  ScopedTimer *in_RDI;
  Params parameterMap;
  ScopedTimer __var2268;
  char in_stack_000004b6;
  char in_stack_000004b7;
  string *in_stack_000004b8;
  void *in_stack_ffffffffffffff98;
  Params *in_stack_ffffffffffffffd8;
  IO *in_stack_ffffffffffffffe0;
  
  if (SetParameters(std::__cxx11::string_const&)::__var268 == '\0') {
    iVar1 = __cxa_guard_acquire(&SetParameters(std::__cxx11::string_const&)::__var268);
    if (iVar1 != 0) {
      SetParameters::__var268 = (void *)ps_timer_create_("IO::other");
      in_stack_ffffffffffffff98 = SetParameters::__var268;
      __cxa_guard_release(&SetParameters(std::__cxx11::string_const&)::__var268);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(in_RDI,in_stack_ffffffffffffff98);
  helper::BuildParametersMap(in_stack_000004b8,in_stack_000004b7,in_stack_000004b6);
  SetParameters(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x89c130);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_RDI);
  return;
}

Assistant:

void IO::SetParameters(const std::string &parameters)
{
    PERFSTUBS_SCOPED_TIMER("IO::other");
    adios2::Params parameterMap = adios2::helper::BuildParametersMap(parameters, '=', ',');
    SetParameters(parameterMap);
}